

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int waitForValue<int>(QPromise<void> *promise,int *initial,int *expected)

{
  QPromiseBase<void> local_48;
  QPromiseBase<void> local_38;
  int local_24;
  int *piStack_20;
  int value;
  int *expected_local;
  int *initial_local;
  QPromise<void> *promise_local;
  
  local_24 = *initial;
  piStack_20 = expected;
  expected_local = initial;
  initial_local = (int *)promise;
  QtPromise::QPromiseBase<void>::
  then<waitForValue<int>(QtPromise::QPromise<void>const&,int_const&,int_const&)::_lambda()_1_>
            (&local_48,(anon_class_16_2_86e0869e *)promise);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_48);
  return local_24;
}

Assistant:

static inline T
waitForValue(const QtPromise::QPromise<void>& promise, const T& initial, const T& expected)
{
    T value(initial);
    promise
        .then([&]() {
            value = expected;
        })
        .wait();
    return value;
}